

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O0

int __thiscall cmCTestUpdateHandler::ProcessHandler(cmCTestUpdateHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  cmCTestCVS *this_00;
  cmCTestSVN *this_01;
  cmCTestBZR *this_02;
  cmCTestGIT *this_03;
  cmCTestP4 *this_04;
  cmCTestVC *pcVar6;
  string *psVar7;
  double dVar8;
  double dVar9;
  int local_1bcc;
  string local_1970 [32];
  undefined1 local_1950 [8];
  ostringstream cmCTestLog_msg_9;
  string local_17d8 [32];
  undefined1 local_17b8 [8];
  ostringstream cmCTestLog_msg_8;
  allocator local_1639;
  string local_1638;
  double local_1618;
  allocator local_1609;
  string local_1608;
  uint local_15e8;
  allocator local_15e1;
  string local_15e0;
  allocator local_15b9;
  string local_15b8;
  undefined1 local_1598 [8];
  string end_time;
  undefined1 local_1558 [8];
  ostringstream cmCTestLog_msg_7;
  string local_13e0 [32];
  undefined1 local_13c0 [8];
  ostringstream cmCTestLog_msg_6;
  string local_1240 [4];
  int numConflicting;
  undefined1 local_1220 [8];
  ostringstream cmCTestLog_msg_5;
  string local_10a0 [4];
  int numModified;
  undefined1 local_1080 [8];
  ostringstream cmCTestLog_msg_4;
  int local_f00;
  int numUpdated;
  int localModifications;
  bool loadedMods;
  allocator local_ee9;
  string local_ee8;
  allocator local_ec1;
  string local_ec0;
  allocator local_e99;
  string local_e98;
  allocator local_e71;
  string local_e70;
  string local_e50;
  string local_e30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  allocator local_dc9;
  string local_dc8;
  allocator local_da1;
  string local_da0;
  allocator local_d79;
  string local_d78;
  string local_d58;
  allocator local_d31;
  string local_d30;
  allocator local_d09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  allocator local_cc1;
  string local_cc0;
  undefined1 local_ca0 [8];
  cmXMLWriter xml;
  string local_c48;
  string local_c28;
  undefined1 local_c08 [8];
  string buildname;
  bool updated;
  double elapsed_time_start;
  undefined1 local_bd0 [4];
  uint start_time_time;
  string start_time;
  undefined1 local_b90 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_a18 [8];
  cmGeneratedFileStream os;
  string local_7c8;
  auto_ptr<cmCTestVC> local_7a8;
  auto_ptr<cmCTestVC> vc;
  undefined1 local_780 [8];
  ostringstream cmCTestLog_msg_2;
  string local_608 [32];
  undefined1 local_5e8 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_470 [8];
  cmGeneratedFileStream ofs;
  string local_220 [32];
  undefined1 local_200 [8];
  ostringstream cmCTestLog_msg;
  allocator local_71;
  string local_70;
  char *local_50;
  char *sourceDirectory;
  cmCLocaleEnvironmentScope fixLocale;
  cmCTestUpdateHandler *this_local;
  
  fixLocale.EnvironmentBackup._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  cmCLocaleEnvironmentScope::cmCLocaleEnvironmentScope
            ((cmCLocaleEnvironmentScope *)&sourceDirectory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"SourceDirectory",&local_71);
  pcVar4 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_50 = pcVar4;
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    poVar5 = std::operator<<((ostream *)local_200,
                             "Cannot find SourceDirectory  key in the DartConfiguration.tcl");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x71,pcVar4,false);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    this_local._4_4_ = -1;
    ofs._580_4_ = 1;
  }
  else {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_470,None);
    bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (!bVar2) {
      cmCTestGenericHandler::StartLogFile
                (&this->super_cmCTestGenericHandler,"Update",(cmGeneratedFileStream *)local_470);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5e8);
    poVar5 = std::operator<<((ostream *)local_5e8,"   Updating the repository: ");
    poVar5 = std::operator<<(poVar5,local_50);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x7d,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_608);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5e8);
    bVar2 = SelectVCS(this);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_780);
      poVar5 = std::operator<<((ostream *)local_780,"   Use ");
      pcVar4 = cmCTestUpdateHandlerUpdateToString(this->UpdateType);
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5," repository type");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                   ,0x86,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string((string *)&vc);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_780);
      ::cm::auto_ptr<cmCTestVC>::auto_ptr(&local_7a8,(cmCTestVC *)0x0);
      switch(this->UpdateType) {
      case 1:
        this_00 = (cmCTestCVS *)operator_new(0x1b8);
        cmCTestCVS::cmCTestCVS
                  (this_00,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_470);
        ::cm::auto_ptr<cmCTestVC>::reset(&local_7a8,(cmCTestVC *)this_00);
        break;
      case 2:
        this_01 = (cmCTestSVN *)operator_new(0x330);
        cmCTestSVN::cmCTestSVN
                  (this_01,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_470);
        ::cm::auto_ptr<cmCTestVC>::reset(&local_7a8,(cmCTestVC *)this_01);
        break;
      case 3:
        this_02 = (cmCTestBZR *)operator_new(0x330);
        cmCTestBZR::cmCTestBZR
                  (this_02,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_470);
        ::cm::auto_ptr<cmCTestVC>::reset(&local_7a8,(cmCTestVC *)this_02);
        break;
      case 4:
        this_03 = (cmCTestGIT *)operator_new(0x318);
        cmCTestGIT::cmCTestGIT
                  (this_03,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_470);
        ::cm::auto_ptr<cmCTestVC>::reset(&local_7a8,(cmCTestVC *)this_03);
        break;
      case 5:
        pcVar6 = (cmCTestVC *)operator_new(0x310);
        cmCTestHG::cmCTestHG
                  ((cmCTestHG *)pcVar6,(this->super_cmCTestGenericHandler).CTest,
                   (ostream *)local_470);
        ::cm::auto_ptr<cmCTestVC>::reset(&local_7a8,pcVar6);
        break;
      case 6:
        this_04 = (cmCTestP4 *)operator_new(0x370);
        cmCTestP4::cmCTestP4(this_04,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_470)
        ;
        ::cm::auto_ptr<cmCTestVC>::reset(&local_7a8,(cmCTestVC *)this_04);
        break;
      default:
        pcVar6 = (cmCTestVC *)operator_new(0x188);
        cmCTestVC::cmCTestVC(pcVar6,(this->super_cmCTestGenericHandler).CTest,(ostream *)local_470);
        ::cm::auto_ptr<cmCTestVC>::reset(&local_7a8,pcVar6);
      }
      pcVar6 = ::cm::auto_ptr<cmCTestVC>::operator->(&local_7a8);
      cmCTestVC::SetCommandLineTool(pcVar6,&this->UpdateCommand);
      pcVar6 = ::cm::auto_ptr<cmCTestVC>::operator->(&local_7a8);
      pcVar4 = local_50;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_7c8,pcVar4,(allocator *)&os.field_0x247);
      cmCTestVC::SetSourceDirectory(pcVar6,&local_7c8);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::allocator<char>::~allocator((allocator<char> *)&os.field_0x247);
      pcVar6 = ::cm::auto_ptr<cmCTestVC>::operator->(&local_7a8);
      cmCTestVC::Cleanup(pcVar6);
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_a18,None);
      bVar2 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartUpdate,"Update",
                         (cmGeneratedFileStream *)local_a18);
      if (bVar2) {
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_bd0,(this->super_cmCTestGenericHandler).CTest);
        dVar8 = cmsys::SystemTools::GetTime();
        elapsed_time_start._4_4_ = (undefined4)(long)dVar8;
        dVar8 = cmsys::SystemTools::GetTime();
        pcVar6 = ::cm::auto_ptr<cmCTestVC>::operator->(&local_7a8);
        buildname.field_2._M_local_buf[0xf] = cmCTestVC::Update(pcVar6);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c48,"BuildName",(allocator *)&xml.field_0x4f);
        cmCTest::GetCTestConfiguration(&local_c28,pcVar1,&local_c48);
        cmCTest::SafeBuildIdField((string *)local_c08,&local_c28);
        std::__cxx11::string::~string((string *)&local_c28);
        std::__cxx11::string::~string((string *)&local_c48);
        std::allocator<char>::~allocator((allocator<char> *)&xml.field_0x4f);
        cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_ca0,(ostream *)local_a18,0);
        cmXMLWriter::StartDocument((cmXMLWriter *)local_ca0,"UTF-8");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_cc0,"Update",&local_cc1);
        cmXMLWriter::StartElement((cmXMLWriter *)local_ca0,&local_cc0);
        std::__cxx11::string::~string((string *)&local_cc0);
        std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
        cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_ca0,"mode",(char (*) [7])0xb9fc0f);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d08,"ctest-",&local_d09);
        pcVar4 = cmVersion::GetCMakeVersion();
        std::operator+(&local_ce8,&local_d08,pcVar4);
        cmXMLWriter::Attribute<std::__cxx11::string>
                  ((cmXMLWriter *)local_ca0,"Generator",&local_ce8);
        std::__cxx11::string::~string((string *)&local_ce8);
        std::__cxx11::string::~string((string *)&local_d08);
        std::allocator<char>::~allocator((allocator<char> *)&local_d09);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d30,"Site",&local_d31);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d78,"Site",&local_d79);
        cmCTest::GetCTestConfiguration(&local_d58,pcVar1,&local_d78);
        cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_ca0,&local_d30,&local_d58);
        std::__cxx11::string::~string((string *)&local_d58);
        std::__cxx11::string::~string((string *)&local_d78);
        std::allocator<char>::~allocator((allocator<char> *)&local_d79);
        std::__cxx11::string::~string((string *)&local_d30);
        std::allocator<char>::~allocator((allocator<char> *)&local_d31);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_da0,"BuildName",&local_da1);
        cmXMLWriter::Element<std::__cxx11::string>
                  ((cmXMLWriter *)local_ca0,&local_da0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c08);
        std::__cxx11::string::~string((string *)&local_da0);
        std::allocator<char>::~allocator((allocator<char> *)&local_da1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_dc8,"BuildStamp",&local_dc9);
        cmCTest::GetCurrentTag_abi_cxx11_(&local_e30,(this->super_cmCTestGenericHandler).CTest);
        std::operator+(&local_e10,&local_e30,"-");
        cmCTest::GetTestModelString_abi_cxx11_(&local_e50,(this->super_cmCTestGenericHandler).CTest)
        ;
        std::operator+(&local_df0,&local_e10,&local_e50);
        cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_ca0,&local_dc8,&local_df0);
        std::__cxx11::string::~string((string *)&local_df0);
        std::__cxx11::string::~string((string *)&local_e50);
        std::__cxx11::string::~string((string *)&local_e10);
        std::__cxx11::string::~string((string *)&local_e30);
        std::__cxx11::string::~string((string *)&local_dc8);
        std::allocator<char>::~allocator((allocator<char> *)&local_dc9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e70,"StartDateTime",&local_e71);
        cmXMLWriter::Element<std::__cxx11::string>
                  ((cmXMLWriter *)local_ca0,&local_e70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bd0);
        std::__cxx11::string::~string((string *)&local_e70);
        std::allocator<char>::~allocator((allocator<char> *)&local_e71);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e98,"StartTime",&local_e99);
        cmXMLWriter::Element<unsigned_int>
                  ((cmXMLWriter *)local_ca0,&local_e98,(uint *)((long)&elapsed_time_start + 4));
        std::__cxx11::string::~string((string *)&local_e98);
        std::allocator<char>::~allocator((allocator<char> *)&local_e99);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_ec0,"UpdateCommand",&local_ec1);
        pcVar6 = ::cm::auto_ptr<cmCTestVC>::operator->(&local_7a8);
        psVar7 = cmCTestVC::GetUpdateCommandLine_abi_cxx11_(pcVar6);
        cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_ca0,&local_ec0,psVar7);
        std::__cxx11::string::~string((string *)&local_ec0);
        std::allocator<char>::~allocator((allocator<char> *)&local_ec1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_ee8,"UpdateType",&local_ee9);
        _localModifications = cmCTestUpdateHandlerUpdateToString(this->UpdateType);
        cmXMLWriter::Element<char_const*>
                  ((cmXMLWriter *)local_ca0,&local_ee8,(char **)&localModifications);
        std::__cxx11::string::~string((string *)&local_ee8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
        pcVar6 = ::cm::auto_ptr<cmCTestVC>::operator->(&local_7a8);
        bVar2 = cmCTestVC::WriteXML(pcVar6,(cmXMLWriter *)local_ca0);
        local_f00 = 0;
        pcVar6 = ::cm::auto_ptr<cmCTestVC>::operator->(&local_7a8);
        local_1bcc = cmCTestVC::GetPathCount(pcVar6,PathUpdated);
        if (local_1bcc != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1080);
          poVar5 = std::operator<<((ostream *)local_1080,"   Found ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1bcc);
          std::operator<<(poVar5," updated files\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xd0,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_10a0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1080);
        }
        pcVar6 = ::cm::auto_ptr<cmCTestVC>::operator->(&local_7a8);
        iVar3 = cmCTestVC::GetPathCount(pcVar6,PathModified);
        if (iVar3 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1220);
          poVar5 = std::operator<<((ostream *)local_1220,"   Found ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
          std::operator<<(poVar5," locally modified files\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xd5,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1240);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1220);
          local_f00 = iVar3;
        }
        pcVar6 = ::cm::auto_ptr<cmCTestVC>::operator->(&local_7a8);
        iVar3 = cmCTestVC::GetPathCount(pcVar6,PathConflicting);
        if (iVar3 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13c0);
          poVar5 = std::operator<<((ostream *)local_13c0,"   Found ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
          std::operator<<(poVar5," conflicting files\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xdb,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_13e0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13c0);
          local_f00 = iVar3 + local_f00;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1558);
        poVar5 = std::operator<<((ostream *)local_1558,"End");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xdf,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)(end_time.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1558);
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_1598,(this->super_cmCTestGenericHandler).CTest);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_15b8,"EndDateTime",&local_15b9);
        cmXMLWriter::Element<std::__cxx11::string>
                  ((cmXMLWriter *)local_ca0,&local_15b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1598);
        std::__cxx11::string::~string((string *)&local_15b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_15b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_15e0,"EndTime",&local_15e1);
        dVar9 = cmsys::SystemTools::GetTime();
        local_15e8 = (uint)(long)dVar9;
        cmXMLWriter::Element<unsigned_int>((cmXMLWriter *)local_ca0,&local_15e0,&local_15e8);
        std::__cxx11::string::~string((string *)&local_15e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_15e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1608,"ElapsedMinutes",&local_1609);
        dVar9 = cmsys::SystemTools::GetTime();
        local_1618 = (double)(int)((dVar9 - dVar8) / 6.0) / 10.0;
        cmXMLWriter::Element<double>((cmXMLWriter *)local_ca0,&local_1608,&local_1618);
        std::__cxx11::string::~string((string *)&local_1608);
        std::allocator<char>::~allocator((allocator<char> *)&local_1609);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1638,"UpdateReturnStatus",&local_1639);
        cmXMLWriter::StartElement((cmXMLWriter *)local_ca0,&local_1638);
        std::__cxx11::string::~string((string *)&local_1638);
        std::allocator<char>::~allocator((allocator<char> *)&local_1639);
        if (local_f00 != 0) {
          cmXMLWriter::Content<char[72]>
                    ((cmXMLWriter *)local_ca0,
                     (char (*) [72])
                     "Update error: There are modified or conflicting files in the repository");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_17b8);
          poVar5 = std::operator<<((ostream *)local_17b8,
                                   "   There are modified or conflicting files in the repository");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,6,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xee,pcVar4,false);
          std::__cxx11::string::~string(local_17d8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_17b8);
        }
        if ((buildname.field_2._M_local_buf[0xf] & 1U) == 0) {
          cmXMLWriter::Content<char[24]>
                    ((cmXMLWriter *)local_ca0,(char (*) [24])"Update command failed:\n");
          pcVar6 = ::cm::auto_ptr<cmCTestVC>::operator->(&local_7a8);
          psVar7 = cmCTestVC::GetUpdateCommandLine_abi_cxx11_(pcVar6);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_ca0,psVar7);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1950);
          poVar5 = std::operator<<((ostream *)local_1950,"   Update command failed: ");
          pcVar6 = ::cm::auto_ptr<cmCTestVC>::operator->(&local_7a8);
          psVar7 = cmCTestVC::GetUpdateCommandLine_abi_cxx11_(pcVar6);
          poVar5 = std::operator<<(poVar5,(string *)psVar7);
          std::operator<<(poVar5,"\n");
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                       ,0xf4,pcVar4,false);
          std::__cxx11::string::~string(local_1970);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1950);
        }
        cmXMLWriter::EndElement((cmXMLWriter *)local_ca0);
        cmXMLWriter::EndElement((cmXMLWriter *)local_ca0);
        cmXMLWriter::EndDocument((cmXMLWriter *)local_ca0);
        if (((buildname.field_2._M_local_buf[0xf] & 1U) == 0) || (!bVar2)) {
          local_1bcc = -1;
        }
        this_local._4_4_ = local_1bcc;
        ofs._580_4_ = 1;
        std::__cxx11::string::~string((string *)local_1598);
        cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_ca0);
        std::__cxx11::string::~string((string *)local_c08);
        std::__cxx11::string::~string((string *)local_bd0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b90);
        poVar5 = std::operator<<((ostream *)local_b90,"Cannot open log file");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                     ,0xad,pcVar4,false);
        std::__cxx11::string::~string((string *)(start_time.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b90);
        this_local._4_4_ = -1;
        ofs._580_4_ = 1;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_a18);
      ::cm::auto_ptr<cmCTestVC>::~auto_ptr(&local_7a8);
    }
    else {
      this_local._4_4_ = -1;
      ofs._580_4_ = 1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_470);
  }
  cmCLocaleEnvironmentScope::~cmCLocaleEnvironmentScope
            ((cmCLocaleEnvironmentScope *)&sourceDirectory);
  return this_local._4_4_;
}

Assistant:

int cmCTestUpdateHandler::ProcessHandler()
{
  // Make sure VCS tool messages are in English so we can parse them.
  cmCLocaleEnvironmentScope fixLocale;
  static_cast<void>(fixLocale);

  // Get source dir
  const char* sourceDirectory = this->GetOption("SourceDirectory");
  if (!sourceDirectory) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find SourceDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  cmGeneratedFileStream ofs;
  if (!this->CTest->GetShowOnly()) {
    this->StartLogFile("Update", ofs);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "   Updating the repository: " << sourceDirectory
                                                    << std::endl,
                     this->Quiet);

  if (!this->SelectVCS()) {
    return -1;
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "   Use "
                       << cmCTestUpdateHandlerUpdateToString(this->UpdateType)
                       << " repository type" << std::endl;
                     , this->Quiet);

  // Create an object to interact with the VCS tool.
  CM_AUTO_PTR<cmCTestVC> vc;
  switch (this->UpdateType) {
    case e_CVS:
      vc.reset(new cmCTestCVS(this->CTest, ofs));
      break;
    case e_SVN:
      vc.reset(new cmCTestSVN(this->CTest, ofs));
      break;
    case e_BZR:
      vc.reset(new cmCTestBZR(this->CTest, ofs));
      break;
    case e_GIT:
      vc.reset(new cmCTestGIT(this->CTest, ofs));
      break;
    case e_HG:
      vc.reset(new cmCTestHG(this->CTest, ofs));
      break;
    case e_P4:
      vc.reset(new cmCTestP4(this->CTest, ofs));
      break;
    default:
      vc.reset(new cmCTestVC(this->CTest, ofs));
      break;
  }
  vc->SetCommandLineTool(this->UpdateCommand);
  vc->SetSourceDirectory(sourceDirectory);

  // Cleanup the working tree.
  vc->Cleanup();

  //
  // Now update repository and remember what files were updated
  //
  cmGeneratedFileStream os;
  if (!this->StartResultingXML(cmCTest::PartUpdate, "Update", os)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open log file"
                 << std::endl);
    return -1;
  }
  std::string start_time = this->CTest->CurrentTime();
  unsigned int start_time_time =
    static_cast<unsigned int>(cmSystemTools::GetTime());
  double elapsed_time_start = cmSystemTools::GetTime();

  bool updated = vc->Update();
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));

  cmXMLWriter xml(os);
  xml.StartDocument();
  xml.StartElement("Update");
  xml.Attribute("mode", "Client");
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  xml.Element("Site", this->CTest->GetCTestConfiguration("Site"));
  xml.Element("BuildName", buildname);
  xml.Element("BuildStamp", this->CTest->GetCurrentTag() + "-" +
                this->CTest->GetTestModelString());
  xml.Element("StartDateTime", start_time);
  xml.Element("StartTime", start_time_time);
  xml.Element("UpdateCommand", vc->GetUpdateCommandLine());
  xml.Element("UpdateType",
              cmCTestUpdateHandlerUpdateToString(this->UpdateType));

  bool loadedMods = vc->WriteXML(xml);

  int localModifications = 0;
  int numUpdated = vc->GetPathCount(cmCTestVC::PathUpdated);
  if (numUpdated) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numUpdated << " updated files\n",
                       this->Quiet);
  }
  if (int numModified = vc->GetPathCount(cmCTestVC::PathModified)) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "   Found "
                         << numModified << " locally modified files\n",
                       this->Quiet);
    localModifications += numModified;
  }
  if (int numConflicting = vc->GetPathCount(cmCTestVC::PathConflicting)) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Found " << numConflicting << " conflicting files\n",
                       this->Quiet);
    localModifications += numConflicting;
  }

  cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
  std::string end_time = this->CTest->CurrentTime();
  xml.Element("EndDateTime", end_time);
  xml.Element("EndTime", static_cast<unsigned int>(cmSystemTools::GetTime()));
  xml.Element(
    "ElapsedMinutes",
    static_cast<int>((cmSystemTools::GetTime() - elapsed_time_start) / 6) /
      10.0);

  xml.StartElement("UpdateReturnStatus");
  if (localModifications) {
    xml.Content("Update error: "
                "There are modified or conflicting files in the repository");
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "   There are modified or conflicting files in the repository"
                 << std::endl);
  }
  if (!updated) {
    xml.Content("Update command failed:\n");
    xml.Content(vc->GetUpdateCommandLine());
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "   Update command failed: "
                 << vc->GetUpdateCommandLine() << "\n");
  }
  xml.EndElement(); // UpdateReturnStatus
  xml.EndElement(); // Update
  xml.EndDocument();
  return updated && loadedMods ? numUpdated : -1;
}